

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_fileWatcher.cpp
# Opt level: O2

char getch(void)

{
  int iVar1;
  int iVar2;
  termios tm_old;
  termios tm;
  termios local_88;
  termios local_44;
  
  iVar1 = tcgetattr(0,&local_44);
  if (-1 < iVar1) {
    local_88.c_ispeed = local_44.c_ispeed;
    local_88.c_ospeed = local_44.c_ospeed;
    local_88.c_cc[0xf] = local_44.c_cc[0xf];
    local_88.c_cc[0x10] = local_44.c_cc[0x10];
    local_88.c_cc[0x11] = local_44.c_cc[0x11];
    local_88.c_cc[0x12] = local_44.c_cc[0x12];
    local_88.c_cc[0x13] = local_44.c_cc[0x13];
    local_88.c_cc[0x14] = local_44.c_cc[0x14];
    local_88.c_cc[0x15] = local_44.c_cc[0x15];
    local_88.c_cc[0x16] = local_44.c_cc[0x16];
    local_88.c_line = local_44.c_line;
    local_88.c_cc[0] = local_44.c_cc[0];
    local_88.c_cc[1] = local_44.c_cc[1];
    local_88.c_cc[2] = local_44.c_cc[2];
    local_88.c_cc[3] = local_44.c_cc[3];
    local_88.c_cc[4] = local_44.c_cc[4];
    local_88.c_cc[5] = local_44.c_cc[5];
    local_88.c_cc[6] = local_44.c_cc[6];
    local_88.c_cc[7] = local_44.c_cc[7];
    local_88.c_cc[8] = local_44.c_cc[8];
    local_88.c_cc[9] = local_44.c_cc[9];
    local_88.c_cc[10] = local_44.c_cc[10];
    local_88.c_cc[0xb] = local_44.c_cc[0xb];
    local_88.c_cc[0xc] = local_44.c_cc[0xc];
    local_88.c_cc[0xd] = local_44.c_cc[0xd];
    local_88.c_cc[0xe] = local_44.c_cc[0xe];
    local_88.c_iflag = local_44.c_iflag;
    local_88.c_oflag = local_44.c_oflag;
    local_88.c_cflag = local_44.c_cflag;
    local_88.c_lflag = local_44.c_lflag;
    cfmakeraw(&local_44);
    iVar1 = tcsetattr(0,0,&local_44);
    if (-1 < iVar1) {
      iVar1 = getchar();
      iVar2 = tcsetattr(0,0,&local_88);
      if (iVar2 < 0) {
        return -1;
      }
      return (char)iVar1;
    }
  }
  return -1;
}

Assistant:

char getch() {
    // https://blog.csdn.net/gaopu12345/article/details/30467099
    struct termios tm;
    int fd = 0, ch;
    if(tcgetattr(fd, &tm) < 0) {
        return -1;
    }
    auto tm_old = tm;
    cfmakeraw(&tm);
    if(tcsetattr(fd, TCSANOW, &tm) < 0) {
        return -1;
    }
    ch = getchar();
    if(tcsetattr(fd, TCSANOW, &tm_old) < 0) {
        return -1;
    }
    return ch;
}